

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::TParseContext::findFunctionExplicitTypes
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TSymbol *pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TParseContext *pTVar4;
  undefined4 extraout_var_02;
  char *pcVar5;
  undefined4 extraout_var_03;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)> local_e0;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)> local_c0;
  TVector<const_glslang::TFunction_*> local_a0;
  TParseContext *local_80;
  TFunction *bestMatch;
  anon_class_8_1_8991fb9c aStack_70;
  bool tie;
  anon_class_8_1_8991fb9c better;
  anon_class_16_2_dbef4af0 convertible;
  TVector<const_glslang::TFunction_*> candidateList;
  TSymbol *symbol;
  bool *builtIn_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar2 = (*(call->super_TSymbol)._vptr_TSymbol[6])();
  pTVar3 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var,iVar2),builtIn,(bool *)0x0,
                              (int *)0x0);
  if (pTVar3 == (TSymbol *)0x0) {
    TVector<const_glslang::TFunction_*>::TVector
              ((TVector<const_glslang::TFunction_*> *)&convertible.builtIn);
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    iVar2 = (*(call->super_TSymbol)._vptr_TSymbol[6])();
    TSymbolTable::findFunctionNameList
              (pTVar1,(TString *)CONCAT44(extraout_var_01,iVar2),
               (TVector<const_glslang::TFunction_*> *)&convertible.builtIn,builtIn);
    convertible.this._0_1_ = *builtIn & 1;
    bestMatch._7_1_ = 0;
    aStack_70.this = this;
    better.this = this;
    TVector<const_glslang::TFunction_*>::TVector
              (&local_a0,(TVector<const_glslang::TFunction_*> *)&convertible.builtIn);
    std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>::
    function<glslang::TParseContext::findFunctionExplicitTypes(glslang::TSourceLoc_const&,glslang::TFunction_const&,bool&)::__0_const&,void>
              ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)> *
               )&local_c0,(anon_class_16_2_dbef4af0 *)&better);
    std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>::
    function<glslang::TParseContext::findFunctionExplicitTypes(glslang::TSourceLoc_const&,glslang::TFunction_const&,bool&)::__1_const&,void>
              ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)> *)
               &local_e0,&stack0xffffffffffffff90);
    pTVar4 = (TParseContext *)
             TParseContextBase::selectFunction
                       (&this->super_TParseContextBase,&local_a0,call,&local_c0,&local_e0,
                        (bool *)((long)&bestMatch + 7));
    std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>::
    ~function(&local_e0);
    std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>::
    ~function(&local_c0);
    TVector<const_glslang::TFunction_*>::~TVector(&local_a0);
    local_80 = pTVar4;
    if (pTVar4 == (TParseContext *)0x0) {
      iVar2 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_02,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"no matching overloaded function found",pcVar5,"");
    }
    else if ((bestMatch._7_1_ & 1) != 0) {
      iVar2 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_03,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"ambiguous best function under implicit type conversion",pcVar5,"");
    }
    this_local = local_80;
    TVector<const_glslang::TFunction_*>::~TVector
              ((TVector<const_glslang::TFunction_*> *)&convertible.builtIn);
  }
  else {
    iVar2 = (*pTVar3->_vptr_TSymbol[7])();
    this_local = (TParseContext *)CONCAT44(extraout_var_00,iVar2);
  }
  return (TFunction *)this_local;
}

Assistant:

const TFunction* TParseContext::findFunctionExplicitTypes(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // no exact match, use the generic selector, parameterized by the GLSL rules

    // create list of candidates to send
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    // can 'from' convert to 'to'?
    const auto convertible = [this,builtIn](const TType& from, const TType& to, TOperator op, int param) -> bool {
        if (from == to)
            return true;
        if (from.coopMatParameterOK(to))
            return true;
        if (from.tensorParameterOK(to))
            return true;
        if (from.getBasicType() == EbtFunction && to.getBasicType() == EbtFunction)
            return true;
        if (from.coopVecParameterOK(to))
            return true;
        // Allow a sized array to be passed through an unsized array parameter, for coopMatLoad/Store functions
        if (builtIn && from.isArray() && to.isUnsizedArray()) {
            TType fromElementType(from, 0);
            TType toElementType(to, 0);
            // Load/store tensor functions allow any element type for the pointer
            if ((op == EOpCooperativeMatrixLoadTensorNV || op == EOpCooperativeMatrixStoreTensorNV) &&
                param == 1 &&
                (from.getQualifier().storage == EvqBuffer || from.getQualifier().storage == EvqShared)) {
                return true;
            }
            if (fromElementType == toElementType)
                return true;
        }
        if (from.isArray() || to.isArray() || ! from.sameElementShape(to))
            return false;
        if (from.isCoopMat() && to.isCoopMat())
            return from.sameCoopMatBaseType(to);
        if (from.isCoopVecNV() && to.isCoopVecNV())
            return from.sameCoopVecBaseType(to);
        return intermediate.canImplicitlyPromote(from.getBasicType(), to.getBasicType());
    };

    // Is 'to2' a better conversion than 'to1'?
    // Ties should not be considered as better.
    // Assumes 'convertible' already said true.
    const auto better = [this](const TType& from, const TType& to1, const TType& to2) -> bool {
        // 1. exact match
        if (from == to2)
            return from != to1;
        if (from == to1)
            return false;

        // 2. Promotion (integral, floating-point) is better
        TBasicType from_type = from.getBasicType();
        TBasicType to1_type = to1.getBasicType();
        TBasicType to2_type = to2.getBasicType();
        bool isPromotion1 = (intermediate.isIntegralPromotion(from_type, to1_type) ||
                             intermediate.isFPPromotion(from_type, to1_type));
        bool isPromotion2 = (intermediate.isIntegralPromotion(from_type, to2_type) ||
                             intermediate.isFPPromotion(from_type, to2_type));
        if (isPromotion2)
            return !isPromotion1;
        if(isPromotion1)
            return false;

        // 3. Conversion (integral, floating-point , floating-integral)
        bool isConversion1 = (intermediate.isIntegralConversion(from_type, to1_type) ||
                              intermediate.isFPConversion(from_type, to1_type) ||
                              intermediate.isFPIntegralConversion(from_type, to1_type));
        bool isConversion2 = (intermediate.isIntegralConversion(from_type, to2_type) ||
                              intermediate.isFPConversion(from_type, to2_type) ||
                              intermediate.isFPIntegralConversion(from_type, to2_type));

        return isConversion2 && !isConversion1;
    };

    // for ambiguity reporting
    bool tie = false;

    // send to the generic selector
    const TFunction* bestMatch = selectFunction(candidateList, call, convertible, better, tie);

    if (bestMatch == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");
    else if (tie)
        error(loc, "ambiguous best function under implicit type conversion", call.getName().c_str(), "");

    return bestMatch;
}